

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linkedlist_find_last.c
# Opt level: O0

void * linkedlist_find_last(s_linkedlist *linked_list,f_matcher matcher,void *matcher_arg)

{
  e_matcher_result eVar1;
  s_linkedlist_node *local_30;
  s_linkedlist_node *node;
  void *matcher_arg_local;
  f_matcher matcher_local;
  s_linkedlist *linked_list_local;
  
  local_30 = linked_list->tail;
  while( true ) {
    if (local_30 == (s_linkedlist_node *)0x0) {
      return (void *)0x0;
    }
    eVar1 = (*matcher)(local_30->element,matcher_arg);
    if (eVar1 == E_MATCHER_RESULT_MATCH) break;
    local_30 = local_30->previous;
  }
  return local_30->element;
}

Assistant:

void *linkedlist_find_last(s_linkedlist *linked_list, f_matcher matcher, void *matcher_arg) {
    s_linkedlist_node *node = linked_list->tail;

    while (node != NULL) {
        if (matcher(node->element, matcher_arg) == E_MATCHER_RESULT_MATCH) {
            return node->element;
        }

        node = node->previous;
    }

    return NULL;
}